

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

double beta_pq2s(pqpair pq,double aa,double bb)

{
  int which;
  double q;
  double p;
  int status;
  double bound;
  double b;
  double a;
  double y;
  double x;
  
  q = pq.q;
  p = pq.p;
  which = 2;
  x = 0.0;
  if (0.0 < p) {
    if (q <= 0.0) {
      x = 1.0;
    }
    else {
      x = 0.0;
      y = 1.0;
      b = bb;
      a = aa;
      cdfbet(&which,&p,&q,&x,&y,&a,&b,&status,&bound);
    }
  }
  return x;
}

Assistant:

static double beta_pq2s( pqpair pq , double aa , double bb )
{
   int which , status ;
   double p,q,x,y,a,b,bound ;

   which  = 2 ;
   p      = pq.p ; if( p <= 0.0 ) return 0.0 ;
   q      = pq.q ; if( q <= 0.0 ) return 1.0 ;
   x      = 0.0 ;
   y      = 1.0 ;
   a      = aa ;
   b      = bb ;

   cdfbet( &which , &p , &q , &x , &y , &a , &b ,  &status , &bound ) ;
   return x ;
}